

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

void check_special_room(boolean newlev)

{
  boolean bVar1;
  int roomno_00;
  int iVar2;
  int iVar3;
  mkroom *pmVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *run;
  int rt;
  int roomno;
  char *ptr;
  monst *mtmp;
  boolean newlev_local;
  
  move_update(newlev);
  if (u.ushops0[0] != '\0') {
    u_left_shop(u.ushops_left,newlev);
  }
  if ((u.uentered[0] != '\0') || (u.ushops_entered[0] != '\0')) {
    if (u.ushops_entered[0] != '\0') {
      u_entered_shop(u.ushops_entered);
    }
    for (_rt = u.uentered; *_rt != '\0'; _rt = _rt + 1) {
      roomno_00 = (int)*_rt;
      iVar2 = roomno_00 + -3;
      run._0_4_ = (int)level->rooms[iVar2].rtype;
      switch((int)run) {
      case 2:
        pline("You enter an opulent throne room!");
        break;
      case 3:
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          bVar7 = false;
          if (ublindf != (obj *)0x0) {
            bVar7 = ublindf->oartifact == '\x1d';
          }
          bVar7 = (bool)(bVar7 ^ 1);
        }
        pcVar5 = "looks";
        if (bVar7) {
          pcVar5 = "feels";
        }
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
          bVar7 = false;
          if (ublindf != (obj *)0x0) {
            bVar7 = ublindf->oartifact == '\x1d';
          }
          bVar7 = (bool)(bVar7 ^ 1);
        }
        pcVar6 = "muddy";
        if (bVar7) {
          pcVar6 = "humid";
        }
        pline("It %s rather %s down here.",pcVar5,pcVar6);
        break;
      case 5:
        pline("You enter a giant beehive!");
        run._0_4_ = 0;
        break;
      case 6:
        iVar3 = midnight();
        if (iVar3 == 0) {
          pline("You have an uncanny feeling...");
        }
        else {
          pcVar5 = locomotion(youmonst.data,"Run");
          pline("%s away!  %s away!",pcVar5,pcVar5);
        }
        break;
      case 7:
        bVar1 = monstinroom(mons + 0x121,iVar2);
        if (((bVar1 == '\0') && (bVar1 = monstinroom(mons + 0x122,iVar2), bVar1 == '\0')) &&
           ((bVar1 = monstinroom(mons + 0x123,iVar2), bVar1 == '\0' &&
            (bVar1 = monstinroom(mons + 0x124,iVar2), bVar1 == '\0')))) {
          pline("You enter an abandoned barracks.");
        }
        else {
          pline("You enter a military barracks!");
        }
        break;
      case 8:
        pline("Welcome to David\'s treasure zoo!");
        break;
      case 9:
        bVar1 = monstinroom(mons + 0x11e,iVar2);
        if (bVar1 != '\0') {
          pcVar5 = Hello((monst *)0x0);
          verbalize("%s, %s, welcome to Delphi!",pcVar5,plname);
        }
        check_tutorial_message(0x16c);
        break;
      case 10:
        intemple(roomno_00);
      default:
        run._0_4_ = 0;
        break;
      case 0xb:
        pline("You enter a leprechaun hall!");
        break;
      case 0xc:
        pline("You enter a disgusting nest!");
        break;
      case 0xd:
        pline("You enter an anthole!");
        break;
      case 0xe:
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pline("You enter a beautiful garden.");
        }
        else {
          pline("The air here smells nice and fresh!");
        }
        run._0_4_ = 0;
        break;
      case 0xf:
        pline("You enter a dilapidated armory.");
        break;
      case 0x10:
        pline("You enter a put of screaming lemures!");
      }
      if ((int)run != 0) {
        level->rooms[iVar2].rtype = '\0';
        pmVar4 = search_special(level,(schar)(int)run);
        if (pmVar4 == (mkroom *)0x0) {
          switch((int)run) {
          case 2:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xfffffff7;
            break;
          case 3:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xfffffbff;
            break;
          case 5:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xffffffbf;
            break;
          case 6:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xffffffef;
            break;
          case 7:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xffffff7f;
            break;
          case 8:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xfffffffb;
            break;
          case 10:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xfffffeff;
            break;
          case 0xe:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xffffffdf;
            break;
          case 0x10:
            *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xfffffdff;
          }
        }
        if ((((int)run == 2) || ((int)run == 3)) ||
           (((int)run == 6 || (((int)run == 8 || ((int)run == 0xe)))))) {
          for (ptr = (char *)level->monlist; ptr != (char *)0x0; ptr = *(char **)ptr) {
            if ((((0 < *(int *)(ptr + 0x2c)) && ('\0' < ptr[0x4f])) && (ptr[0x4f] < 'P')) &&
               ((-1 < ptr[0x50] && (ptr[0x50] < '\x15')))) {
              pcVar5 = in_rooms(level,ptr[0x4f],ptr[0x50],0);
              pcVar5 = strchr(pcVar5,roomno_00);
              if ((pcVar5 != (char *)0x0) &&
                 ((((u.uprops[0x13].intrinsic == 0 && (u.uprops[0x13].extrinsic == 0)) ||
                   (u.uprops[0x13].blocked != 0)) && (iVar2 = rn2(3), iVar2 == 0)))) {
                *(uint *)(ptr + 0x60) = *(uint *)(ptr + 0x60) & 0xfff7ffff;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void check_special_room(boolean newlev)
{
	struct monst *mtmp;
	char *ptr;

	move_update(newlev);

	if (*u.ushops0)
	    u_left_shop(u.ushops_left, newlev);

	if (!*u.uentered && !*u.ushops_entered)		/* implied by newlev */
	    return;		/* no entrance messages necessary */

	/* Did we just enter a shop? */
	if (*u.ushops_entered)
	    u_entered_shop(u.ushops_entered);

	for (ptr = &u.uentered[0]; *ptr; ptr++) {
	    int roomno = *ptr - ROOMOFFSET;
	    int rt = level->rooms[roomno].rtype;

	    /* Did we just enter some other special room? */
	    /* vault.c insists that a vault remain a VAULT,
	     * and temples should remain TEMPLEs,
	     * but everything else gives a message only the first time */
	    switch (rt) {
		case ZOO:
		    pline("Welcome to David's treasure zoo!");
		    break;
		case GARDEN:
		    if (Blind) pline("The air here smells nice and fresh!");
		    else pline("You enter a beautiful garden.");
		    rt = 0;
		    break;
		case SWAMP:
		    pline("It %s rather %s down here.",
			  Blind ? "feels" : "looks",
			  Blind ? "humid" : "muddy");
		    break;
		case COURT:
		    pline("You enter an opulent throne room!");
		    break;
		case LEPREHALL:
		    pline("You enter a leprechaun hall!");
		    break;
		case MORGUE:
		    if (midnight()) {
			const char *run = locomotion(youmonst.data, "Run");
			pline("%s away!  %s away!", run, run);
		    } else
			pline("You have an uncanny feeling...");
		    break;
		case BEEHIVE:
		    pline("You enter a giant beehive!");
		    rt = 0;
		    break;
		case LEMUREPIT:
		    pline("You enter a put of screaming lemures!");
		    break;
		case COCKNEST:
		    pline("You enter a disgusting nest!");
		    break;
		case ARMORY:
		    pline("You enter a dilapidated armory.");
		    break;
		case ANTHOLE:
		    pline("You enter an anthole!");
		    break;
		case BARRACKS:
		    if (monstinroom(&mons[PM_SOLDIER], roomno) ||
			monstinroom(&mons[PM_SERGEANT], roomno) ||
			monstinroom(&mons[PM_LIEUTENANT], roomno) ||
			monstinroom(&mons[PM_CAPTAIN], roomno))
			pline("You enter a military barracks!");
		    else
			pline("You enter an abandoned barracks.");
		    break;
		case DELPHI:
		    if (monstinroom(&mons[PM_ORACLE], roomno))
			verbalize("%s, %s, welcome to Delphi!",
					Hello(NULL), plname);
		    check_tutorial_message(QT_T_ORACLE);
		    break;
		case TEMPLE:
		    intemple(roomno + ROOMOFFSET);
		    /* fall through */
		default:
		    rt = 0;
	    }

	    if (rt != 0) {
		level->rooms[roomno].rtype = OROOM;
		if (!search_special(level, rt)) {
			/* No more room of that type */
			switch(rt) {
			    case COURT:
				level->flags.has_court = 0;
				break;
			    case GARDEN:
				level->flags.has_garden = 0;
				break;
			    case SWAMP:
				level->flags.has_swamp = 0;
				break;
			    case MORGUE:
				level->flags.has_morgue = 0;
				break;
			    case ZOO:
				level->flags.has_zoo = 0;
				break;
			    case BARRACKS:
				level->flags.has_barracks = 0;
				break;
			    case TEMPLE:
				level->flags.has_temple = 0;
				break;
			    case BEEHIVE:
				level->flags.has_beehive = 0;
				break;
			    case LEMUREPIT:
				level->flags.has_lemurepit = 0;
				break;
			}
		}
		if (rt == COURT || rt == SWAMP || rt == MORGUE ||
			rt == ZOO || rt == GARDEN) {
		    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
			if (!DEADMONSTER(mtmp) && isok(mtmp->mx, mtmp->my) &&
				/* wake monsters in the room, not the whole level */
				strchr(in_rooms(level, mtmp->mx, mtmp->my, 0),
				       roomno + ROOMOFFSET) &&
				!Stealth && !rn2(3))
			    mtmp->msleeping = 0;
		    }
		}
	    }
	}

	return;
}